

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_view_field.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::cpp::anon_unknown_4::SingularStringView::
GenerateNonInlineAccessorDefinitions(SingularStringView *this,Printer *p)

{
  if ((((((this->super_FieldGeneratorBase).field_)->field_20).default_value_enum_)->all_names_ !=
       (string *)0x0) && (this->opts_->experimental_use_micro_string == false)) {
    io::Printer::Emit(p,0,0,0x97,
                      "\n      /*static*/ const ::_pbi::LazyString $Msg$::$default_variable_field${\n          {{$kDefault$, $kDefaultLen$}},\n          {nullptr},\n      };\n    "
                     );
    return;
  }
  return;
}

Assistant:

void GenerateNonInlineAccessorDefinitions(io::Printer* p) const override {
    if (EmptyDefault() || use_micro_string()) return;
    p->Emit(R"cc(
      /*static*/ const ::_pbi::LazyString $Msg$::$default_variable_field${
          {{$kDefault$, $kDefaultLen$}},
          {nullptr},
      };
    )cc");
  }